

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O2

size_t omp_capture_affinity(char *buffer,char *format,size_t buf_size,size_t for_size)

{
  int gtid;
  size_t sVar1;
  ConvertedString cformat;
  kmp_str_buf_t capture_buf;
  ConvertedString local_250;
  kmp_str_buf_t local_240;
  
  if (__kmp_init_middle == 0) {
    __kmp_middle_initialize();
  }
  gtid = __kmp_get_global_thread_id();
  local_240.str = local_240.bulk;
  local_240.size = 0x200;
  local_240.used = 0;
  local_240.bulk[0] = '\0';
  ConvertedString::ConvertedString(&local_250,format,for_size);
  sVar1 = __kmp_aux_capture_affinity(gtid,local_250.buf,&local_240);
  if (buf_size != 0 && buffer != (char *)0x0) {
    __kmp_fortran_strncpy_truncate(buffer,buf_size,local_240.str,(long)local_240.used);
  }
  __kmp_str_buf_free(&local_240);
  ConvertedString::~ConvertedString(&local_250);
  return sVar1;
}

Assistant:

size_t FTN_STDCALL FTN_CAPTURE_AFFINITY(char *buffer, char const *format,
                                        size_t buf_size, size_t for_size) {
#if defined(KMP_STUB)
  return 0;
#else
  int gtid;
  size_t num_required;
  kmp_str_buf_t capture_buf;
  if (!TCR_4(__kmp_init_middle)) {
    __kmp_middle_initialize();
  }
  gtid = __kmp_get_gtid();
  __kmp_str_buf_init(&capture_buf);
  ConvertedString cformat(format, for_size);
  num_required = __kmp_aux_capture_affinity(gtid, cformat.get(), &capture_buf);
  if (buffer && buf_size) {
    __kmp_fortran_strncpy_truncate(buffer, buf_size, capture_buf.str,
                                   capture_buf.used);
  }
  __kmp_str_buf_free(&capture_buf);
  return num_required;
#endif
}